

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorProto::_internal_has_options(FileDescriptorProto *this)

{
  long in_RDI;
  bool value;
  
  return (*(uint *)(in_RDI + 0x10) & 8) != 0;
}

Assistant:

inline bool FileDescriptorProto::_internal_has_options() const {
  bool value = (_has_bits_[0] & 0x00000008u) != 0;
  PROTOBUF_ASSUME(!value || options_ != nullptr);
  return value;
}